

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRContainer * __thiscall MinVR::VRDatum::getValueContainer_abi_cxx11_(VRDatum *this)

{
  undefined8 uVar1;
  string *in_stack_00000108;
  int *in_stack_00000110;
  string *in_stack_00000118;
  string *in_stack_00000120;
  string *in_stack_00000128;
  VRError *in_stack_00000130;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  
  uVar1 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  VRError::VRError(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                   in_stack_00000110,in_stack_00000108);
  __cxa_throw(uVar1,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

virtual VRContainer getValueContainer() const {
    VRERROR("This datum is not a VRContainer.", "It is a " + description + ".");
  }